

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O0

ExtPubkey *
cfd::core::ConfidentialTransaction::GenerateExtPubkeyFromDescriptor
          (ExtPubkey *__return_storage_ptr__,string *bitcoin_descriptor,uint32_t bip32_counter,
          ByteData *prefix,NetType net_type,NetType elements_net_type,ExtPubkey *base_ext_pubkey,
          Address *descriptor_derive_address)

{
  bool bVar1;
  __type _Var2;
  NetType NVar3;
  Bip32FormatType BVar4;
  AddressType AVar5;
  AddressType AVar6;
  AddressType AVar7;
  AddressType AVar8;
  undefined8 uVar9;
  reference pvVar10;
  undefined4 in_stack_ffffffffffffd820;
  AddressType in_stack_ffffffffffffd824;
  undefined4 in_stack_ffffffffffffd828;
  undefined4 in_stack_ffffffffffffd82c;
  undefined4 in_stack_ffffffffffffd830;
  uint uVar11;
  undefined4 in_stack_ffffffffffffd834;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffd838;
  CfdError CVar12;
  CfdException *in_stack_ffffffffffffd840;
  CfdException *this;
  byte bVar13;
  uint in_stack_ffffffffffffd84c;
  undefined4 in_stack_ffffffffffffd860;
  undefined4 uVar14;
  undefined4 in_stack_ffffffffffffd864;
  char *in_stack_ffffffffffffd868;
  bool local_276e;
  Address local_2728;
  ExtPubkey local_25a8;
  vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
  local_2518;
  DescriptorScriptReference local_2500;
  DescriptorScriptReference local_2198;
  Descriptor local_1e30;
  string local_1cc0 [32];
  string local_1ca0 [32];
  string local_1c80 [32];
  string local_1c60 [32];
  string local_1c40 [32];
  string local_1c20 [32];
  string local_1c00;
  undefined1 local_1be0 [8];
  string xpub_str;
  string local_1ba0;
  ExtPubkey local_1b80;
  vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
  local_1af0;
  DescriptorScriptReference local_1ad8;
  DescriptorScriptReference local_1770;
  undefined1 local_1408 [8];
  DescriptorScriptReference derive_script;
  ByteData local_1078;
  string local_1060;
  CfdSourceLocation local_1040;
  byte local_1021;
  ByteData local_1020;
  ExtPubkey local_1008;
  undefined1 local_f72;
  allocator local_f71;
  string local_f70 [32];
  CfdSourceLocation local_f50;
  vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
  local_f38;
  undefined1 local_f20 [8];
  DescriptorKeyReference key_ref;
  allocator local_8b1;
  string local_8b0 [32];
  CfdSourceLocation local_890;
  undefined1 local_878 [8];
  DescriptorScriptReference script_ref;
  Descriptor desc;
  undefined1 local_380 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  arg_list;
  value_type local_360;
  undefined1 local_340 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  arg_list_base;
  CfdException *except;
  string local_2e0 [32];
  string local_2c0 [32];
  string local_2a0 [32];
  string local_280 [32];
  string local_260 [32];
  string local_240 [32];
  string local_220 [39];
  byte local_1f9;
  ByteData local_1f8;
  byte local_1d9;
  undefined1 local_1d8 [7];
  bool is_mainnet_key;
  ExtPubkey check_key;
  string desc_str;
  ExtPubkey xpub;
  string local_90 [35];
  undefined1 local_6d;
  allocator local_59;
  string local_58 [39];
  byte local_31;
  NetType local_30;
  NetType NStack_2c;
  bool is_mainnet;
  NetType elements_net_type_local;
  NetType net_type_local;
  ByteData *prefix_local;
  string *psStack_18;
  uint32_t bip32_counter_local;
  string *bitcoin_descriptor_local;
  ExtPubkey *child_xpub;
  
  local_31 = 0;
  local_30 = elements_net_type;
  NStack_2c = net_type;
  _elements_net_type_local = prefix;
  prefix_local._4_4_ = bip32_counter;
  psStack_18 = bitcoin_descriptor;
  bitcoin_descriptor_local = (string *)__return_storage_ptr__;
  if (net_type == kMainnet) {
    local_31 = 1;
  }
  else if (1 < net_type - kTestnet) {
    local_6d = 1;
    uVar9 = __cxa_allocate_exception(0x30);
    CVar12 = (CfdError)((ulong)in_stack_ffffffffffffd838 >> 0x20);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_58,"Illegal bitcoin network type error.",&local_59);
    CfdException::CfdException
              (in_stack_ffffffffffffd840,CVar12,
               (string *)CONCAT44(in_stack_ffffffffffffd834,in_stack_ffffffffffffd830));
    local_6d = 0;
    __cxa_throw(uVar9,&CfdException::typeinfo,CfdException::~CfdException);
  }
  if (elements_net_type < kLiquidV1) {
    xpub.super_Extkey.tweak_sum_.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
    uVar9 = __cxa_allocate_exception(0x30);
    CVar12 = (CfdError)((ulong)in_stack_ffffffffffffd838 >> 0x20);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              (local_90,"Illegal elements network type error.",
               (allocator *)
               ((long)&xpub.super_Extkey.tweak_sum_.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data + 0x17));
    CfdException::CfdException
              (in_stack_ffffffffffffd840,CVar12,
               (string *)CONCAT44(in_stack_ffffffffffffd834,in_stack_ffffffffffffd830));
    xpub.super_Extkey.tweak_sum_.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
    __cxa_throw(uVar9,&CfdException::typeinfo,CfdException::~CfdException);
  }
  xpub.super_Extkey.tweak_sum_.data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._5_1_ = 0;
  ExtPubkey::ExtPubkey(__return_storage_ptr__);
  ExtPubkey::ExtPubkey((ExtPubkey *)((long)&desc_str.field_2 + 8));
  ::std::__cxx11::string::string
            ((string *)
             ((long)&check_key.super_Extkey.tweak_sum_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data + 0x10),(string *)psStack_18);
  ExtPubkey::ExtPubkey((ExtPubkey *)local_1d8,psStack_18);
  NVar3 = Extkey::GetNetworkType((Extkey *)local_1d8);
  local_1d9 = NVar3 == kMainnet;
  local_1f9 = 0;
  bVar1 = ByteData::IsEmpty(_elements_net_type_local);
  local_276e = false;
  if (!bVar1) {
    Extkey::GetVersionData(&local_1f8,(Extkey *)local_1d8);
    local_1f9 = 1;
    local_276e = ByteData::Equals(&local_1f8,_elements_net_type_local);
  }
  if ((local_1f9 & 1) != 0) {
    ByteData::~ByteData((ByteData *)0x4ea232);
  }
  if (local_276e == false) {
    if ((local_31 & 1) == (local_1d9 & 1)) {
      BVar4 = Extkey::GetFormatType((Extkey *)local_1d8);
      if (BVar4 == kBip49) {
        ::std::operator+(in_stack_ffffffffffffd868,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_ffffffffffffd864,in_stack_ffffffffffffd860));
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_ffffffffffffd82c,in_stack_ffffffffffffd828),
                         (char *)CONCAT44(in_stack_ffffffffffffd824,in_stack_ffffffffffffd820));
        ::std::__cxx11::string::operator=
                  ((string *)
                   ((long)&check_key.super_Extkey.tweak_sum_.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data + 0x10),local_260);
        ::std::__cxx11::string::~string(local_260);
        ::std::__cxx11::string::~string(local_280);
      }
      else if (BVar4 == kBip84) {
        ::std::operator+(in_stack_ffffffffffffd868,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_ffffffffffffd864,in_stack_ffffffffffffd860));
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_ffffffffffffd82c,in_stack_ffffffffffffd828),
                         (char *)CONCAT44(in_stack_ffffffffffffd824,in_stack_ffffffffffffd820));
        ::std::__cxx11::string::operator=
                  ((string *)
                   ((long)&check_key.super_Extkey.tweak_sum_.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data + 0x10),local_2a0);
        ::std::__cxx11::string::~string(local_2a0);
        ::std::__cxx11::string::~string(local_2c0);
      }
      else {
        ::std::operator+(in_stack_ffffffffffffd868,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_ffffffffffffd864,in_stack_ffffffffffffd860));
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_ffffffffffffd82c,in_stack_ffffffffffffd828),
                         (char *)CONCAT44(in_stack_ffffffffffffd824,in_stack_ffffffffffffd820));
        ::std::__cxx11::string::operator=
                  ((string *)
                   ((long)&check_key.super_Extkey.tweak_sum_.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data + 0x10),local_2e0);
        ::std::__cxx11::string::~string(local_2e0);
        ::std::__cxx11::string::~string((string *)&except);
      }
    }
  }
  else {
    ::std::operator+(in_stack_ffffffffffffd868,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_ffffffffffffd864,in_stack_ffffffffffffd860));
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_ffffffffffffd82c,in_stack_ffffffffffffd828),
                     (char *)CONCAT44(in_stack_ffffffffffffd824,in_stack_ffffffffffffd820));
    ::std::__cxx11::string::operator=
              ((string *)
               ((long)&check_key.super_Extkey.tweak_sum_.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data + 0x10),local_220);
    ::std::__cxx11::string::~string(local_220);
    ::std::__cxx11::string::~string(local_240);
  }
  ExtPubkey::~ExtPubkey((ExtPubkey *)0x4ea50b);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x4ea5b7);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string
            ((string *)&local_360,"base",
             (allocator *)
             ((long)&arg_list.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_340,&local_360);
  ::std::__cxx11::string::~string((string *)&local_360);
  ::std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&arg_list.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x4ea61f);
  ::std::__cxx11::to_string(in_stack_ffffffffffffd84c);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_380,(value_type *)&desc.root_node_.network_type_);
  ::std::__cxx11::string::~string((string *)&desc.root_node_.network_type_);
  Descriptor::Parse((Descriptor *)
                    &script_ref.addr_prefixes_.
                     super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                    (string *)
                    ((long)&check_key.super_Extkey.tweak_sum_.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data + 0x10),
                    (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                     *)0x0,kMainnet);
  Descriptor::GetReference
            ((DescriptorScriptReference *)local_878,
             (Descriptor *)
             &script_ref.addr_prefixes_.
              super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_340);
  AVar5 = DescriptorScriptReference::GetAddressType((DescriptorScriptReference *)local_878);
  if (((AVar5 != kP2pkhAddress) && (AVar5 != kP2wpkhAddress)) && (AVar5 != kP2shP2wpkhAddress)) {
    local_890.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/cfdcore_elements_transaction.cpp"
                 ,0x2f);
    CVar12 = (CfdError)((ulong)in_stack_ffffffffffffd838 >> 0x20);
    local_890.filename = local_890.filename + 1;
    local_890.line = 0xdd2;
    local_890.funcname = "GenerateExtPubkeyFromDescriptor";
    logger::warn<>(&local_890,"bitcoin_descriptor invalid type.");
    uVar9 = __cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              (local_8b0,
               "bitcoin_descriptor is not of any type supported: pkh(<xpub>), sh(wpkh(<xpub>)), wpkh(<xpub>), or <xpub>."
               ,&local_8b1);
    CfdException::CfdException
              (in_stack_ffffffffffffd840,CVar12,
               (string *)CONCAT44(in_stack_ffffffffffffd834,in_stack_ffffffffffffd830));
    __cxa_throw(uVar9,&CfdException::typeinfo,CfdException::~CfdException);
  }
  AVar5 = DescriptorScriptReference::GetAddressType((DescriptorScriptReference *)local_878);
  if (AVar5 == kP2shP2wpkhAddress) {
    DescriptorScriptReference::GetChild
              ((DescriptorScriptReference *)((long)&key_ref.argument_.field_2 + 8),
               (DescriptorScriptReference *)local_878);
    DescriptorScriptReference::operator=
              ((DescriptorScriptReference *)local_878,
               (DescriptorScriptReference *)((long)&key_ref.argument_.field_2 + 8));
    DescriptorScriptReference::~DescriptorScriptReference
              ((DescriptorScriptReference *)
               CONCAT44(in_stack_ffffffffffffd824,in_stack_ffffffffffffd820));
  }
  DescriptorScriptReference::GetKeyList(&local_f38,(DescriptorScriptReference *)local_878);
  pvVar10 = ::std::
            vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
            ::operator[](&local_f38,0);
  DescriptorKeyReference::DescriptorKeyReference((DescriptorKeyReference *)local_f20,pvVar10);
  ::std::
  vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>::
  ~vector((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
           *)CONCAT44(in_stack_ffffffffffffd834,in_stack_ffffffffffffd830));
  bVar1 = DescriptorKeyReference::HasExtPubkey((DescriptorKeyReference *)local_f20);
  uVar14 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffd860);
  if (!bVar1) {
    local_f50.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/cfdcore_elements_transaction.cpp"
                 ,0x2f);
    CVar12 = (CfdError)((ulong)in_stack_ffffffffffffd838 >> 0x20);
    local_f50.filename = local_f50.filename + 1;
    local_f50.line = 0xdde;
    local_f50.funcname = "GenerateExtPubkeyFromDescriptor";
    logger::warn<>(&local_f50,"bitcoin_descriptor invalid extkey format.");
    local_f72 = 1;
    uVar9 = __cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_f70,"BitcoinDescriptor invalid extkey format.",&local_f71);
    CfdException::CfdException
              (in_stack_ffffffffffffd840,CVar12,
               (string *)CONCAT44(in_stack_ffffffffffffd834,in_stack_ffffffffffffd830));
    local_f72 = 0;
    __cxa_throw(uVar9,&CfdException::typeinfo,CfdException::~CfdException);
  }
  DescriptorKeyReference::GetExtPubkey(&local_1008,(DescriptorKeyReference *)local_f20);
  ExtPubkey::operator=(base_ext_pubkey,&local_1008);
  ExtPubkey::~ExtPubkey((ExtPubkey *)0x4eaafa);
  local_1021 = 0;
  bVar1 = ByteData::IsEmpty(_elements_net_type_local);
  bVar13 = 0;
  if (!bVar1) {
    Extkey::GetVersionData(&local_1020,&base_ext_pubkey->super_Extkey);
    local_1021 = 1;
    bVar1 = ByteData::Equals(&local_1020,_elements_net_type_local);
    bVar13 = bVar1 ^ 0xff;
  }
  uVar11 = (uint)bVar13;
  if ((local_1021 & 1) != 0) {
    ByteData::~ByteData((ByteData *)0x4eab89);
  }
  if ((uVar11 & 1) == 0) {
    DescriptorScriptReference::DescriptorScriptReference((DescriptorScriptReference *)local_1408);
    Descriptor::GetReference
              (&local_1770,
               (Descriptor *)
               &script_ref.addr_prefixes_.
                super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_380);
    DescriptorScriptReference::operator=((DescriptorScriptReference *)local_1408,&local_1770);
    DescriptorScriptReference::~DescriptorScriptReference
              ((DescriptorScriptReference *)
               CONCAT44(in_stack_ffffffffffffd824,in_stack_ffffffffffffd820));
    DescriptorScriptReference::operator=
              ((DescriptorScriptReference *)local_878,(DescriptorScriptReference *)local_1408);
    AVar6 = DescriptorScriptReference::GetAddressType((DescriptorScriptReference *)local_878);
    if (AVar6 == kP2shP2wpkhAddress) {
      DescriptorScriptReference::GetChild(&local_1ad8,(DescriptorScriptReference *)local_878);
      DescriptorScriptReference::operator=((DescriptorScriptReference *)local_878,&local_1ad8);
      DescriptorScriptReference::~DescriptorScriptReference
                ((DescriptorScriptReference *)
                 CONCAT44(in_stack_ffffffffffffd824,in_stack_ffffffffffffd820));
    }
    DescriptorScriptReference::GetKeyList(&local_1af0,(DescriptorScriptReference *)local_878);
    pvVar10 = ::std::
              vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
              ::operator[](&local_1af0,0);
    DescriptorKeyReference::operator=((DescriptorKeyReference *)local_f20,pvVar10);
    ::std::
    vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>::
    ~vector((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
             *)CONCAT44(AVar6,in_stack_ffffffffffffd830));
    DescriptorKeyReference::GetExtPubkey(&local_1b80,(DescriptorKeyReference *)local_f20);
    ExtPubkey::operator=(__return_storage_ptr__,&local_1b80);
    ExtPubkey::~ExtPubkey((ExtPubkey *)0x4eaef8);
    Extkey::ToString_abi_cxx11_(&local_1ba0,&__return_storage_ptr__->super_Extkey);
    Extkey::ToString_abi_cxx11_
              ((string *)((long)&xpub_str.field_2 + 8),&base_ext_pubkey->super_Extkey);
    _Var2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_ffffffffffffd840,in_stack_ffffffffffffd838);
    uVar11 = CONCAT13(_Var2,(int3)in_stack_ffffffffffffd830);
    ::std::__cxx11::string::~string((string *)(xpub_str.field_2._M_local_buf + 8));
    ::std::__cxx11::string::~string((string *)&local_1ba0);
    if ((uVar11 & 0x1000000) != 0) {
      Extkey::ToString_abi_cxx11_(&local_1c00,&base_ext_pubkey->super_Extkey);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_ffffffffffffd82c,in_stack_ffffffffffffd828),
                       (char *)CONCAT44(in_stack_ffffffffffffd824,in_stack_ffffffffffffd820));
      ::std::__cxx11::string::~string((string *)&local_1c00);
      AVar7 = DescriptorScriptReference::GetAddressType((DescriptorScriptReference *)local_1408);
      if (AVar7 == kP2shP2wpkhAddress) {
        ::std::operator+(in_stack_ffffffffffffd868,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(AVar5,uVar14));
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(AVar7,in_stack_ffffffffffffd828),
                         (char *)CONCAT44(in_stack_ffffffffffffd824,in_stack_ffffffffffffd820));
        ::std::__cxx11::string::operator=((string *)local_1be0,local_1c20);
        ::std::__cxx11::string::~string(local_1c20);
        ::std::__cxx11::string::~string(local_1c40);
      }
      else {
        AVar8 = DescriptorScriptReference::GetAddressType((DescriptorScriptReference *)local_1408);
        if (AVar8 == kP2wpkhAddress) {
          ::std::operator+(in_stack_ffffffffffffd868,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT44(AVar5,uVar14));
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT44(AVar7,AVar8),
                           (char *)CONCAT44(in_stack_ffffffffffffd824,in_stack_ffffffffffffd820));
          ::std::__cxx11::string::operator=((string *)local_1be0,local_1c60);
          ::std::__cxx11::string::~string(local_1c60);
          ::std::__cxx11::string::~string(local_1c80);
        }
        else {
          ::std::operator+(in_stack_ffffffffffffd868,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT44(AVar5,uVar14));
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT44(AVar7,AVar8),
                           (char *)CONCAT44(in_stack_ffffffffffffd824,in_stack_ffffffffffffd820));
          ::std::__cxx11::string::operator=((string *)local_1be0,local_1ca0);
          ::std::__cxx11::string::~string(local_1ca0);
          ::std::__cxx11::string::~string(local_1cc0);
        }
      }
      Descriptor::Parse(&local_1e30,(string *)local_1be0,
                        (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                         *)0x0,kMainnet);
      Descriptor::operator=
                ((Descriptor *)
                 &script_ref.addr_prefixes_.
                  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_1e30);
      Descriptor::~Descriptor((Descriptor *)0x4eb22c);
      Descriptor::GetReference
                (&local_2198,
                 (Descriptor *)
                 &script_ref.addr_prefixes_.
                  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_380);
      DescriptorScriptReference::operator=((DescriptorScriptReference *)local_1408,&local_2198);
      DescriptorScriptReference::~DescriptorScriptReference
                ((DescriptorScriptReference *)
                 CONCAT44(in_stack_ffffffffffffd824,in_stack_ffffffffffffd820));
      DescriptorScriptReference::operator=
                ((DescriptorScriptReference *)local_878,(DescriptorScriptReference *)local_1408);
      in_stack_ffffffffffffd824 =
           DescriptorScriptReference::GetAddressType((DescriptorScriptReference *)local_878);
      if (in_stack_ffffffffffffd824 == kP2shP2wpkhAddress) {
        DescriptorScriptReference::GetChild(&local_2500,(DescriptorScriptReference *)local_878);
        DescriptorScriptReference::operator=((DescriptorScriptReference *)local_878,&local_2500);
        DescriptorScriptReference::~DescriptorScriptReference
                  ((DescriptorScriptReference *)
                   CONCAT44(in_stack_ffffffffffffd824,in_stack_ffffffffffffd820));
      }
      DescriptorScriptReference::GetKeyList(&local_2518,(DescriptorScriptReference *)local_878);
      pvVar10 = ::std::
                vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                ::operator[](&local_2518,0);
      DescriptorKeyReference::operator=((DescriptorKeyReference *)local_f20,pvVar10);
      ::std::
      vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
      ::~vector((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                 *)CONCAT44(AVar6,uVar11));
      DescriptorKeyReference::GetExtPubkey(&local_25a8,(DescriptorKeyReference *)local_f20);
      ExtPubkey::operator=(__return_storage_ptr__,&local_25a8);
      ExtPubkey::~ExtPubkey((ExtPubkey *)0x4eb3a8);
      ::std::__cxx11::string::~string((string *)local_1be0);
    }
    if (descriptor_derive_address != (Address *)0x0) {
      DescriptorScriptReference::GenerateAddress
                (&local_2728,(DescriptorScriptReference *)local_1408,NStack_2c);
      core::Address::operator=(descriptor_derive_address,&local_2728);
      core::Address::~Address
                ((Address *)CONCAT44(in_stack_ffffffffffffd824,in_stack_ffffffffffffd820));
    }
    xpub.super_Extkey.tweak_sum_.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._5_1_ = 1;
    DescriptorScriptReference::~DescriptorScriptReference
              ((DescriptorScriptReference *)
               CONCAT44(in_stack_ffffffffffffd824,in_stack_ffffffffffffd820));
    DescriptorKeyReference::~DescriptorKeyReference
              ((DescriptorKeyReference *)
               CONCAT44(in_stack_ffffffffffffd824,in_stack_ffffffffffffd820));
    DescriptorScriptReference::~DescriptorScriptReference
              ((DescriptorScriptReference *)
               CONCAT44(in_stack_ffffffffffffd824,in_stack_ffffffffffffd820));
    Descriptor::~Descriptor((Descriptor *)0x4eb489);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)CONCAT44(AVar6,uVar11));
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)CONCAT44(AVar6,uVar11));
    ::std::__cxx11::string::~string
              ((string *)
               ((long)&check_key.super_Extkey.tweak_sum_.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data + 0x10));
    ExtPubkey::~ExtPubkey((ExtPubkey *)0x4eb4b9);
    if ((xpub.super_Extkey.tweak_sum_.data_.
         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._5_1_ & 1) == 0) {
      ExtPubkey::~ExtPubkey((ExtPubkey *)0x4eb532);
    }
    return __return_storage_ptr__;
  }
  local_1040.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/cfdcore_elements_transaction.cpp"
               ,0x2f);
  local_1040.filename = local_1040.filename + 1;
  local_1040.line = 0xde5;
  local_1040.funcname = "GenerateExtPubkeyFromDescriptor";
  Extkey::GetVersionData(&local_1078,(Extkey *)((long)&desc_str.field_2 + 8));
  ByteData::GetHex_abi_cxx11_(&local_1060,&local_1078);
  logger::warn<std::__cxx11::string>
            (&local_1040,"bitcoin_descriptor illegal prefix[{}].",&local_1060);
  ::std::__cxx11::string::~string((string *)&local_1060);
  ByteData::~ByteData((ByteData *)0x4eac29);
  derive_script.addr_prefixes_.
  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
  uVar9 = __cxa_allocate_exception(0x30);
  this = (CfdException *)
         ((long)&derive_script.addr_prefixes_.
                 super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string
            ((string *)&stack0xffffffffffffef68,"bitcoin_descriptor illegal prefix.",
             (allocator *)this);
  CfdException::CfdException
            (this,(CfdError)((ulong)uVar9 >> 0x20),
             (string *)CONCAT44(in_stack_ffffffffffffd834,in_stack_ffffffffffffd830));
  derive_script.addr_prefixes_.
  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
  __cxa_throw(uVar9,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

ExtPubkey ConfidentialTransaction::GenerateExtPubkeyFromDescriptor(
    const std::string &bitcoin_descriptor, uint32_t bip32_counter,
    const ByteData &prefix, NetType net_type, NetType elements_net_type,
    ExtPubkey *base_ext_pubkey, Address *descriptor_derive_address) {
  bool is_mainnet = false;
  switch (net_type) {
    case NetType::kMainnet:
      is_mainnet = true;
      break;
    case NetType::kTestnet:
      // fall-through
    case NetType::kRegtest:
      break;
    default:
      throw CfdException(
          kCfdIllegalArgumentError, "Illegal bitcoin network type error.");
  }
  switch (elements_net_type) {
    case NetType::kMainnet:
    case NetType::kTestnet:
    case NetType::kRegtest:
      throw CfdException(
          kCfdIllegalArgumentError, "Illegal elements network type error.");
    case NetType::kLiquidV1:
    case NetType::kElementsRegtest:
    case NetType::kCustomChain:
    default:
      break;
  }

  ExtPubkey child_xpub;
  ExtPubkey xpub;
  std::string desc_str = bitcoin_descriptor;
  try {
    // check extkey (not output descriptor)
    ExtPubkey check_key(bitcoin_descriptor);
    bool is_mainnet_key = check_key.GetNetworkType() == kMainnet;
    if ((!prefix.IsEmpty()) && check_key.GetVersionData().Equals(prefix)) {
      desc_str = "pkh(" + bitcoin_descriptor + ")";  // create pkh descriptor
    } else if (is_mainnet == is_mainnet_key) {
      switch (check_key.GetFormatType()) {
        case kBip49:
          desc_str = "sh(wpkh(" + bitcoin_descriptor + "))";
          break;
        case kBip84:
          desc_str = "wpkh(" + bitcoin_descriptor + ")";
          break;
        default:
          desc_str = "pkh(" + bitcoin_descriptor + ")";
      }
    }
  } catch (const CfdException &except) {
    info(
        CFD_LOG_SOURCE, "bitcoin_descriptor check fail. go on next check.({})",
        except.what());
    // other descriptor
  }

  std::vector<std::string> arg_list_base;
  arg_list_base.push_back(std::string(kArgumentBaseExtkey));
  std::vector<std::string> arg_list;
  arg_list.push_back(std::to_string(bip32_counter));
  Descriptor desc = Descriptor::Parse(desc_str);
  DescriptorScriptReference script_ref = desc.GetReference(&arg_list_base);
  switch (script_ref.GetAddressType()) {
    case AddressType::kP2pkhAddress:
      // fall-through
    case AddressType::kP2wpkhAddress:
      // fall-through
    case AddressType::kP2shP2wpkhAddress:
      break;
    default:
      warn(CFD_LOG_SOURCE, "bitcoin_descriptor invalid type.");
      throw CfdException(
          kCfdIllegalArgumentError,
          "bitcoin_descriptor is not of any type supported: pkh(<xpub>), "
          "sh(wpkh(<xpub>)), wpkh(<xpub>), or <xpub>.");
  }

  if (script_ref.GetAddressType() == AddressType::kP2shP2wpkhAddress) {
    script_ref = script_ref.GetChild();
  }
  DescriptorKeyReference key_ref = script_ref.GetKeyList()[0];
  if (!key_ref.HasExtPubkey()) {
    warn(CFD_LOG_SOURCE, "bitcoin_descriptor invalid extkey format.");
    throw CfdException(
        kCfdIllegalArgumentError, "BitcoinDescriptor invalid extkey format.");
  }
  *base_ext_pubkey = key_ref.GetExtPubkey();
  if (!prefix.IsEmpty() && !base_ext_pubkey->GetVersionData().Equals(prefix)) {
    warn(
        CFD_LOG_SOURCE, "bitcoin_descriptor illegal prefix[{}].",
        xpub.GetVersionData().GetHex());
    throw CfdException(
        kCfdIllegalArgumentError, "bitcoin_descriptor illegal prefix.");
  }

  // collect derive key
  DescriptorScriptReference derive_script;
  derive_script = desc.GetReference(&arg_list);
  script_ref = derive_script;
  if (script_ref.GetAddressType() == AddressType::kP2shP2wpkhAddress) {
    script_ref = script_ref.GetChild();
  }
  key_ref = script_ref.GetKeyList()[0];
  child_xpub = key_ref.GetExtPubkey();

  // If it is the same as base, add a default path.
  if (child_xpub.ToString() == base_ext_pubkey->ToString()) {
    std::string xpub_str = base_ext_pubkey->ToString() + "/0/*";
    if (derive_script.GetAddressType() == AddressType::kP2shP2wpkhAddress) {
      xpub_str = "sh(wpkh(" + xpub_str + "))";
    } else if (derive_script.GetAddressType() == AddressType::kP2wpkhAddress) {
      xpub_str = "wpkh(" + xpub_str + ")";
    } else {
      xpub_str = "pkh(" + xpub_str + ")";
    }
    desc = Descriptor::Parse(xpub_str);
    derive_script = desc.GetReference(&arg_list);
    script_ref = derive_script;
    if (script_ref.GetAddressType() == AddressType::kP2shP2wpkhAddress) {
      script_ref = script_ref.GetChild();
    }
    key_ref = script_ref.GetKeyList()[0];
    child_xpub = key_ref.GetExtPubkey();
  }

  if (descriptor_derive_address != nullptr) {
    *descriptor_derive_address = derive_script.GenerateAddress(net_type);
  }
  return child_xpub;
}